

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

void anon_unknown.dwarf_65694::evalCtors
               (Module *wasm,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *ctors,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *keptExports)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  Name exportName;
  Name funcName_00;
  bool bVar1;
  type __args_1;
  pointer pMVar2;
  mapped_type *this_00;
  ostream *poVar3;
  Fatal *this_01;
  Name *pNVar4;
  size_type sVar5;
  Function *this_02;
  long lVar6;
  Nop *pNVar7;
  Literals *values;
  Expression *pEVar8;
  Export *this_03;
  Name NVar9;
  Name NVar10;
  Name NVar11;
  Name NVar12;
  Name NVar13;
  FailToEvalException *fail;
  string_view local_8f0;
  Builder local_8e0;
  BasicType local_8d4;
  Type local_8d0 [2];
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_8c0;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_898;
  undefined4 local_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  long local_860;
  Function *copyFunc;
  char *pcStack_850;
  undefined1 auStack_840 [8];
  Name copyName;
  Function *func;
  Name local_808;
  Export *local_7f8;
  Export *exp;
  Name local_7e8;
  size_t local_7d8;
  char *pcStack_7d0;
  undefined1 local_7c8 [8];
  EvalCtorOutcome outcome;
  Name funcName;
  Name local_5f0;
  Export *local_5e0;
  Export *ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ctor;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_588 [8];
  EvallingModuleRunner instance;
  undefined1 local_320 [8];
  CtorEvalExternalInterface interface;
  undefined1 local_208 [8];
  shared_ptr<(anonymous_namespace)::EvallingModuleRunner> envInstance;
  undefined1 local_1c8 [8];
  CtorEvalExternalInterface envInterface;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> envModule;
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  linkedInstances;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6b;
  key_equal local_6a;
  hasher local_69;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  undefined1 local_58 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keptExportsSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keptExports_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ctors_local;
  Module *wasm_local;
  
  keptExportsSet._M_h._M_single_bucket = (__node_base_ptr)keptExports;
  local_60._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(keptExports);
  local_68._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)keptExportsSet._M_h._M_single_bucket);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_6b);
  std::
  unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::
  unordered_set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_58,local_60,local_68,0,&local_69,&local_6a,&local_6b);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_6b);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&envModule);
  buildEnvModule((anon_unknown_dwarf_65694 *)
                 &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload
                  .super__Optional_payload_base<wasm::Block_*>._M_engaged,wasm);
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = &envInstance.
          super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)this);
  CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)local_1c8,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)this);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)&envInstance.
             super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount);
  __args_1 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator*
                       ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)
                        &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>.
                         _M_payload.super__Optional_payload_base<wasm::Block_*>._M_engaged);
  interface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Block_*>._8_8_ = local_1c8;
  std::
  make_shared<(anonymous_namespace)::EvallingModuleRunner,wasm::Module&,(anonymous_namespace)::CtorEvalExternalInterface*>
            ((Module *)local_208,(CtorEvalExternalInterface **)__args_1);
  pMVar2 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)
                      &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>.
                       _M_payload.super__Optional_payload_base<wasm::Block_*>._M_engaged);
  this_00 = std::
            map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
            ::operator[]((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                          *)&envModule,&pMVar2->name);
  std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>::operator=
            (this_00,(shared_ptr<(anonymous_namespace)::EvallingModuleRunner> *)local_208);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
            linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&envModule);
  CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)local_320,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                 linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)&instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
             linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&__range2,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&envModule);
  EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)local_588,wasm,(ExternalInterface *)local_320,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&__range2);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)&__range2);
  ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::instantiate
            ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)local_588);
  interface.usedGlobalNames._M_h._M_single_bucket._0_1_ = 1;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(ctors);
  ctor = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(ctors);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&ctor);
    if (!bVar1) break;
    ex = (Export *)
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end2);
    if (((anonymous_namespace)::quiet & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"trying to eval ");
      poVar3 = std::operator<<(poVar3,(string *)ex);
      std::operator<<(poVar3,'\n');
    }
    ::wasm::Name::Name(&local_5f0,(string *)ex);
    NVar9.super_IString.str._M_str = (char *)local_5f0.super_IString.str._M_len;
    NVar9.super_IString.str._M_len = (size_t)wasm;
    local_5e0 = (Export *)::wasm::Module::getExportOrNull(NVar9);
    if ((local_5e0 == (Export *)0x0) || (local_5e0->kind != Function)) {
      ::wasm::Fatal::Fatal((Fatal *)&funcName.super_IString.str._M_str);
      this_01 = ::wasm::Fatal::operator<<
                          ((Fatal *)&funcName.super_IString.str._M_str,
                           (char (*) [19])"export not found: ");
      ::wasm::Fatal::operator<<
                (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ex);
      ::wasm::Fatal::~Fatal((Fatal *)&funcName.super_IString.str._M_str);
    }
    pNVar4 = ::wasm::Export::getInternalName(local_5e0);
    local_7d8 = (pNVar4->super_IString).str._M_len;
    pcStack_7d0 = (pNVar4->super_IString).str._M_str;
    outcome.super__Optional_base<wasm::Literals,_false,_false>._M_payload.
    super__Optional_payload<wasm::Literals,_true,_false,_false>.
    super__Optional_payload_base<wasm::Literals>._56_8_ = local_7d8;
    funcName.super_IString.str._M_len = (size_t)pcStack_7d0;
    ::wasm::Name::Name(&local_7e8,(string *)ex);
    funcName_00.super_IString.str._M_str = pcStack_7d0;
    funcName_00.super_IString.str._M_len = local_7d8;
    exportName.super_IString.str._M_str = local_7e8.super_IString.str._M_str;
    exportName.super_IString.str._M_len = local_7e8.super_IString.str._M_len;
    evalCtor((EvalCtorOutcome *)local_7c8,(EvallingModuleRunner *)local_588,
             (CtorEvalExternalInterface *)local_320,funcName_00,exportName);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_7c8);
    if (bVar1) {
      if (((anonymous_namespace)::quiet & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"  ...success on ");
        poVar3 = std::operator<<(poVar3,(string *)ex);
        std::operator<<(poVar3,".\n");
      }
      ::wasm::Name::Name(&local_808,(string *)ex);
      NVar10.super_IString.str._M_str = (char *)local_808.super_IString.str._M_len;
      NVar10.super_IString.str._M_len = (size_t)wasm;
      local_7f8 = (Export *)::wasm::Module::getExport(NVar10);
      sVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_58,(key_type *)ex);
      if (sVar5 == 0) {
        NVar11.super_IString.str._M_str = (char *)(local_7f8->name).super_IString.str._M_len;
        NVar11.super_IString.str._M_len = (size_t)wasm;
        ::wasm::Module::removeExport(NVar11);
      }
      else {
        if (local_7f8->kind == Function) {
          pNVar4 = ::wasm::Export::getInternalName(local_7f8);
          copyName.super_IString.str._M_str = (char *)(pNVar4->super_IString).str._M_len;
        }
        else {
          ::wasm::Name::Name((Name *)&copyName.super_IString.str._M_str);
        }
        NVar12.super_IString.str._M_str = copyName.super_IString.str._M_str;
        NVar12.super_IString.str._M_len = (size_t)wasm;
        this_02 = (Function *)::wasm::Module::getFunction(NVar12);
        copyFunc = (Function *)(this_02->super_Importable).super_Named.name.super_IString.str._M_len
        ;
        pcStack_850 = (this_02->super_Importable).super_Named.name.super_IString.str._M_str;
        NVar9 = ::wasm::Names::getValidFunctionName
                          (wasm,(Name)(this_02->super_Importable).super_Named.name.super_IString.str
                          );
        auStack_840._0_4_ = (undefined4)NVar9.super_IString.str._M_len;
        auStack_840._4_4_ = NVar9.super_IString.str._M_len._4_4_;
        copyName.super_IString.str._M_len._0_4_ = NVar9.super_IString.str._M_str._0_4_;
        copyName.super_IString.str._M_len._4_4_ = NVar9.super_IString.str._M_str._4_4_;
        local_878 = auStack_840._0_4_;
        uStack_874 = auStack_840._4_4_;
        uStack_870 = (undefined4)copyName.super_IString.str._M_len;
        uStack_86c = copyName.super_IString.str._M_len._4_4_;
        auStack_840 = (undefined1  [8])NVar9.super_IString.str._M_len;
        copyName.super_IString.str._M_len = (size_t)NVar9.super_IString.str._M_str;
        std::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::optional();
        std::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::optional();
        lVar6 = ::wasm::ModuleUtils::copyFunction
                          (this_02,wasm,CONCAT44(uStack_874,local_878),
                           CONCAT44(uStack_86c,uStack_870),&local_898,&local_8c0);
        std::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~optional
                  (&local_8c0);
        std::optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~optional
                  (&local_898);
        local_860 = lVar6;
        local_8d0[0] = ::wasm::Function::getResults(this_02);
        local_8d4 = none;
        bVar1 = ::wasm::Type::operator==(local_8d0,&local_8d4);
        if (bVar1) {
          ::wasm::Builder::Builder(&local_8e0,wasm);
          pNVar7 = ::wasm::Builder::makeNop(&local_8e0);
          *(Nop **)(local_860 + 0x60) = pNVar7;
        }
        else {
          values = std::optional<wasm::Literals>::operator*((optional<wasm::Literals> *)local_7c8);
          ::wasm::Name::Name((Name *)&local_8f0);
          pEVar8 = CtorEvalExternalInterface::getSerialization
                             ((CtorEvalExternalInterface *)local_320,values,(Name)local_8f0);
          *(Expression **)(local_860 + 0x60) = pEVar8;
        }
        NVar13.super_IString.str._M_str = (char *)(local_7f8->name).super_IString.str._M_len;
        NVar13.super_IString.str._M_len = (size_t)wasm;
        this_03 = (Export *)::wasm::Module::getExport(NVar13);
        pNVar4 = ::wasm::Export::getInternalName(this_03);
        ::wasm::Name::operator=(pNVar4,(Name *)auStack_840);
      }
      exp._4_4_ = 0;
    }
    else {
      if (((anonymous_namespace)::quiet & 1) == 0) {
        std::operator<<((ostream *)&std::cout,"  ...stopping\n");
      }
      exp._4_4_ = 1;
    }
    std::optional<wasm::Literals>::~optional((optional<wasm::Literals> *)local_7c8);
    if (exp._4_4_ != 0) goto LAB_00195d60;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  exp._4_4_ = 0;
LAB_00195d60:
  EvallingModuleRunner::~EvallingModuleRunner((EvallingModuleRunner *)local_588);
  if (exp._4_4_ == 0) {
    exp._4_4_ = 0;
  }
  CtorEvalExternalInterface::~CtorEvalExternalInterface((CtorEvalExternalInterface *)local_320);
  std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::EvallingModuleRunner> *)local_208);
  CtorEvalExternalInterface::~CtorEvalExternalInterface((CtorEvalExternalInterface *)local_1c8);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)
             &envInterface.startBlock.super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Block_*>._M_engaged);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)&envModule);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
  return;
}

Assistant:

void evalCtors(Module& wasm,
               std::vector<std::string>& ctors,
               std::vector<std::string>& keptExports) {
  std::unordered_set<std::string> keptExportsSet(keptExports.begin(),
                                                 keptExports.end());

  std::map<Name, std::shared_ptr<EvallingModuleRunner>> linkedInstances;

  // build and link the env module
  auto envModule = buildEnvModule(wasm);
  CtorEvalExternalInterface envInterface;
  auto envInstance =
    std::make_shared<EvallingModuleRunner>(*envModule, &envInterface);
  linkedInstances[envModule->name] = envInstance;

  CtorEvalExternalInterface interface(linkedInstances);
  try {
    // create an instance for evalling
    EvallingModuleRunner instance(wasm, &interface, linkedInstances);
    instance.instantiate();
    interface.instanceInitialized = true;
    // go one by one, in order, until we fail
    // TODO: if we knew priorities, we could reorder?
    for (auto& ctor : ctors) {
      if (!quiet) {
        std::cout << "trying to eval " << ctor << '\n';
      }
      Export* ex = wasm.getExportOrNull(ctor);
      if (!ex || ex->kind != ExternalKind::Function) {
        Fatal() << "export not found: " << ctor;
      }
      auto funcName = *ex->getInternalName();
      auto outcome = evalCtor(instance, interface, funcName, ctor);
      if (!outcome) {
        if (!quiet) {
          std::cout << "  ...stopping\n";
        }
        return;
      }

      // Success! And we can continue to try more.
      if (!quiet) {
        std::cout << "  ...success on " << ctor << ".\n";
      }

      // Remove the export if we should.
      auto* exp = wasm.getExport(ctor);
      if (!keptExportsSet.count(ctor)) {
        wasm.removeExport(exp->name);
      } else {
        // We are keeping around the export, which should now refer to an
        // empty function since calling the export should do nothing.
        auto* func = wasm.getFunction((exp->kind == ExternalKind::Function)
                                        ? *exp->getInternalName()
                                        : Name());
        auto copyName = Names::getValidFunctionName(wasm, func->name);
        auto* copyFunc = ModuleUtils::copyFunction(func, wasm, copyName);
        if (func->getResults() == Type::none) {
          copyFunc->body = Builder(wasm).makeNop();
        } else {
          copyFunc->body = interface.getSerialization(*outcome);
        }
        *wasm.getExport(exp->name)->getInternalName() = copyName;
      }
    }
  } catch (FailToEvalException& fail) {
    // that's it, we failed to even create the instance
    if (!quiet) {
      std::cout << "  ...stopping since could not create module instance: "
                << fail.why << "\n";
    }
    return;
  }
}